

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_subject_alt_name(uchar **p,uchar *end,mbedtls_x509_sequence *subject_alt_name)

{
  size_t local_38;
  size_t len;
  mbedtls_x509_sequence *pmStack_28;
  int ret;
  mbedtls_x509_sequence *subject_alt_name_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  pmStack_28 = subject_alt_name;
  subject_alt_name_local = (mbedtls_x509_sequence *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (len._4_4_ == 0) {
    if ((mbedtls_x509_sequence *)(*(long *)end_local + local_38) == subject_alt_name_local) {
      p_local._4_4_ =
           mbedtls_x509_get_subject_alt_name_ext
                     ((uchar **)end_local,(uchar *)subject_alt_name_local,pmStack_28);
    }
    else {
      p_local._4_4_ =
           mbedtls_error_add(-0x2500,-0x66,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                             ,0x534);
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2500,len._4_4_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                           ,0x52f);
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_subject_alt_name(unsigned char **p,
                                      const unsigned char *end,
                                      mbedtls_x509_sequence *subject_alt_name)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /* Get main sequence tag */
    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return mbedtls_x509_get_subject_alt_name_ext(p, end, subject_alt_name);
}